

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O2

void r4mat_uniform_01(int m,int n,int *seed,float *r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  iVar1 = *seed;
  if (iVar1 != 0) {
    uVar5 = 0;
    uVar6 = 0;
    if (0 < m) {
      uVar6 = (ulong)(uint)m;
    }
    uVar4 = (ulong)(uint)n;
    if (n < 1) {
      uVar4 = uVar5;
    }
    for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        iVar2 = (iVar1 % 0x1f31d) * 0x41a7;
        iVar1 = (iVar1 / 0x1f31d) * -0xb14;
        iVar3 = iVar2 + iVar1;
        iVar1 = iVar2 + iVar1 + 0x7fffffff;
        if (-1 < iVar3) {
          iVar1 = iVar3;
        }
        *seed = iVar1;
        r[uVar7] = (float)iVar1 * 4.656613e-10;
      }
      r = r + m;
    }
    return;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"R4MAT_UNIFORM_01 - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  Input value of SEED = 0.\n");
  exit(1);
}

Assistant:

void r4mat_uniform_01 ( int m, int n, int &seed, float r[] )

//****************************************************************************80
//
//  Purpose:
//
//    R4MAT_UNIFORM_01 returns a unit pseudorandom R4MAT.
//
//  Discussion:
//
//    An R4MAT is an array of R4's.
//
//    This routine implements the recursion
//
//      seed = ( 16807 * seed ) mod ( 2^31 - 1 )
//      u = seed / ( 2^31 - 1 )
//
//    The integer arithmetic never requires more than 32 bits,
//    including a sign bit.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    03 October 2005
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Paul Bratley, Bennett Fox, Linus Schrage,
//    A Guide to Simulation,
//    Second Edition,
//    Springer, 1987,
//    ISBN: 0387964673,
//    LC: QA76.9.C65.B73.
//
//    Bennett Fox,
//    Algorithm 647:
//    Implementation and Relative Efficiency of Quasirandom
//    Sequence Generators,
//    ACM Transactions on Mathematical Software,
//    Volume 12, Number 4, December 1986, pages 362-376.
//
//    Pierre L'Ecuyer,
//    Random Number Generation,
//    in Handbook of Simulation,
//    edited by Jerry Banks,
//    Wiley, 1998,
//    ISBN: 0471134031,
//    LC: T57.62.H37.
//
//    Peter Lewis, Allen Goodman, James Miller,
//    A Pseudo-Random Number Generator for the System/360,
//    IBM Systems Journal,
//    Volume 8, Number 2, 1969, pages 136-143.
//
//  Parameters:
//
//    Input, int M, N, the number of rows and columns.
//
//    Input/output, int &SEED, the "seed" value.  Normally, this
//    value should not be 0.  On output, SEED has
//    been updated.
//
//    Output, float R[M*N], a matrix of pseudorandom values.
//
{
  int i;
  int i4_huge = 2147483647;
  int j;
  int k;

  if ( seed == 0 )
  {
    cerr << "\n";
    cerr << "R4MAT_UNIFORM_01 - Fatal error!\n";
    cerr << "  Input value of SEED = 0.\n";
    exit ( 1 );
  }

  for ( j = 0; j < n; j++ )
  {
    for ( i = 0; i < m; i++ )
    {
      k = seed / 127773;

      seed = 16807 * ( seed - k * 127773 ) - k * 2836;

      if ( seed < 0 )
      {
        seed = seed + i4_huge;
      }

      r[i+j*m] = static_cast<float>(seed) * 4.656612875E-10;
    }
  }
  return;
}